

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlWriter::swap(XmlWriter *this,XmlWriter *other)

{
  XmlWriter *other_local;
  XmlWriter *this_local;
  
  std::swap<bool>(&this->m_tagIsOpen,&other->m_tagIsOpen);
  std::swap<bool>(&this->m_needsNewline,&other->m_needsNewline);
  std::swap<std::__cxx11::string,std::allocator<std::__cxx11::string>>(&this->m_tags,&other->m_tags)
  ;
  std::swap<char,std::char_traits<char>,std::allocator<char>>(&this->m_indent,&other->m_indent);
  std::swap<std::ostream*>(&this->m_os,&other->m_os);
  return;
}

Assistant:

void swap( XmlWriter& other ) {
            std::swap( m_tagIsOpen, other.m_tagIsOpen );
            std::swap( m_needsNewline, other.m_needsNewline );
            std::swap( m_tags, other.m_tags );
            std::swap( m_indent, other.m_indent );
            std::swap( m_os, other.m_os );
        }